

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

void __thiscall
nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>>::
initialize<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>>
          (optional<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>> *this,
          Animatable<tinyusdz::GeomCamera::Projection> *value)

{
  if (*this != (optional<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>>)0x1) {
    tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>::Animatable
              ((Animatable<tinyusdz::GeomCamera::Projection> *)(this + 8),value);
    *this = (optional<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>>)0x1;
    return;
  }
  __assert_fail("! has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x5dd,
                "void nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>>::initialize(V &&) [T = tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>, V = tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>]"
               );
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }